

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommaInitializer.h
# Opt level: O3

CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> * __thiscall
Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
          (CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *this,Scalar *s)

{
  Scalar SVar1;
  long lVar2;
  
  lVar2 = this->m_col;
  if (lVar2 == 3) {
    lVar2 = this->m_row + this->m_currentBlockRows;
    this->m_row = lVar2;
    this->m_col = 0;
    this->m_currentBlockRows = 1;
    if (2 < lVar2) {
      __assert_fail("m_row<m_xpr.rows() && \"Too many rows passed to comma initializer (operator<<)\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CommaInitializer.h"
                    ,0x49,
                    "CommaInitializer<MatrixType> &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 3>>::operator,(const Scalar &) [MatrixType = Eigen::Matrix<double, 3, 3>]"
                   );
    }
    lVar2 = 0;
  }
  else {
    if (2 < lVar2) {
      __assert_fail("m_col<m_xpr.cols() && \"Too many coefficients passed to comma initializer (operator<<)\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CommaInitializer.h"
                    ,0x4c,
                    "CommaInitializer<MatrixType> &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 3>>::operator,(const Scalar &) [MatrixType = Eigen::Matrix<double, 3, 3>]"
                   );
    }
    if (this->m_currentBlockRows != 1) {
      __assert_fail("m_currentBlockRows==1",
                    "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CommaInitializer.h"
                    ,0x4d,
                    "CommaInitializer<MatrixType> &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 3>>::operator,(const Scalar &) [MatrixType = Eigen::Matrix<double, 3, 3>]"
                   );
    }
  }
  SVar1 = *s;
  this->m_col = lVar2 + 1;
  (this->m_xpr->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
  [lVar2 * 3 + this->m_row] = SVar1;
  return this;
}

Assistant:

EIGEN_DEVICE_FUNC
  CommaInitializer& operator,(const Scalar& s)
  {
    if (m_col==m_xpr.cols())
    {
      m_row+=m_currentBlockRows;
      m_col = 0;
      m_currentBlockRows = 1;
      eigen_assert(m_row<m_xpr.rows()
        && "Too many rows passed to comma initializer (operator<<)");
    }
    eigen_assert(m_col<m_xpr.cols()
      && "Too many coefficients passed to comma initializer (operator<<)");
    eigen_assert(m_currentBlockRows==1);
    m_xpr.coeffRef(m_row, m_col++) = s;
    return *this;
  }